

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

size_t slang::ast::countGenMembers(SyntaxNode *syntax)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = 0;
  for (; syntax->kind == IfGenerate; syntax = *(SyntaxNode **)(*(long *)(syntax + 6) + 0x28)) {
    sVar3 = countGenMembers(syntax[5].previewNode);
    if (*(long *)(syntax + 6) == 0) goto LAB_002fe14b;
    lVar7 = lVar7 + sVar3;
  }
  sVar3 = 1;
  if (syntax->kind == CaseGenerate) {
    pSVar1 = syntax[7].parent;
    pSVar2 = syntax[7].previewNode;
    sVar3 = 0;
    for (lVar6 = 0; (long)pSVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
      piVar4 = *(int **)((long)&pSVar1->kind + lVar6);
      if (*piVar4 == 0x1b6) {
        piVar4 = piVar4 + 0x18;
      }
      else {
        piVar4 = piVar4 + 0xe;
      }
      sVar5 = countGenMembers(*(SyntaxNode **)piVar4);
      sVar3 = sVar3 + sVar5;
    }
  }
LAB_002fe14b:
  return sVar3 + lVar7;
}

Assistant:

static size_t countGenMembers(const SyntaxNode& syntax) {
    switch (syntax.kind) {
        case SyntaxKind::IfGenerate: {
            auto& ifGen = syntax.as<IfGenerateSyntax>();
            size_t count = countGenMembers(*ifGen.block);
            if (ifGen.elseClause)
                count += countGenMembers(*ifGen.elseClause->clause);

            return count;
        }
        case SyntaxKind::CaseGenerate: {
            auto& caseGen = syntax.as<CaseGenerateSyntax>();
            size_t count = 0;
            for (auto item : caseGen.items) {
                switch (item->kind) {
                    case SyntaxKind::StandardCaseItem:
                        count += countGenMembers(*item->as<StandardCaseItemSyntax>().clause);
                        break;
                    case SyntaxKind::DefaultCaseItem:
                        count += countGenMembers(*item->as<DefaultCaseItemSyntax>().clause);
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            return count;
        }
        default: {
            return 1;
        }
    }
}